

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O2

xcb_visualid_t __thiscall
QXcbEglIntegration::getCompatibleVisualId
          (QXcbEglIntegration *this,xcb_screen_t *screen,EGLConfig config)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  xcb_visualid_t xVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  char local_90 [24];
  undefined8 local_78;
  EGLint configAlphaSize;
  EGLint configBlueSize;
  EGLint configGreenSize;
  EGLint configRedSize;
  EGLint eglValue;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  eglValue = 0;
  configRedSize = 0;
  eglGetConfigAttrib(this->m_egl_display,config,0x3024);
  configGreenSize = 0;
  eglGetConfigAttrib(this->m_egl_display,config,0x3023);
  configBlueSize = 0;
  eglGetConfigAttrib(this->m_egl_display,config,0x3022);
  configAlphaSize = 0;
  eglGetConfigAttrib(this->m_egl_display,config,0x3021);
  eglGetConfigAttrib(this->m_egl_display,config,0x3028,&eglValue);
  uVar5 = (ulong)(uint)eglValue;
  eglGetConfigAttrib(this->m_egl_display,config,0x302e);
  xVar9 = eglValue;
  uVar10 = (ulong)(uint)eglValue;
  if (uVar10 == 0) {
    lVar4 = QtPrivateLogging::lcQpaGl();
    if ((*(byte *)(lVar4 + 0x10) & 1) != 0) {
      uStack_40 = *(char **)(lVar4 + 8);
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      QMessageLogger::debug
                (local_58,
                 "EGL did not suggest a VisualID (EGL_NATIVE_VISUAL_ID was zero) for EGLConfig %d",
                 uVar5);
    }
LAB_001084dd:
    local_58._16_4_ = 0xaaaaaaaa;
    local_58[0x14] = 0xaa;
    local_58[0x15] = 0xaa;
    local_58[0x16] = 0xaa;
    local_58[0x17] = 0xaa;
    uStack_40 = (char *)0xaaaaaaaaaaaaaaaa;
    local_58._0_4_ = 0xaaaaaaaa;
    local_58._4_4_ = 0xaaaaaaaa;
    local_58._8_4_ = 0xaaaaaaaa;
    local_58._12_4_ = 0xaaaaaaaa;
    anon_unknown.dwarf_12357::getVisualInfo
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58,screen,
               (optional<unsigned_int>)0x0,
               (optional<unsigned_char>)
               ((short)configGreenSize + (short)configRedSize + (short)configBlueSize +
                (short)configAlphaSize & 0xffU | 0x100));
    if ((bool)uStack_40._4_1_ == false) {
      anon_unknown.dwarf_12357::getVisualInfo
                ((optional<(anonymous_namespace)::VisualInfo> *)local_58,screen,
                 (optional<unsigned_int>)0x0,
                 (optional<unsigned_char>)
                 ((short)configGreenSize + (short)configRedSize + (short)configBlueSize & 0xffU |
                 0x100));
    }
    if ((uStack_40._4_1_ & 1) != 0) {
      std::optional<(anonymous_namespace)::VisualInfo>::operator->
                ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
      xVar9 = local_58._0_4_;
      uVar10 = (ulong)(uint)local_58._0_4_;
      if (local_58._0_4_ != 0) {
        lVar4 = QtPrivateLogging::lcQpaGl();
        if ((*(byte *)(lVar4 + 0x10) & 1) == 0) goto LAB_001085a2;
        uStack_40 = *(char **)(lVar4 + 8);
        pcVar3 = "Using Visual ID %d provided by getVisualInfo for EGL config %d";
        goto LAB_00108596;
      }
    }
    local_58._0_4_ = 2;
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    uStack_40 = "default";
    xVar9 = 0;
    QMessageLogger::warning
              (local_58,"Unable to find an X11 visual which matches EGL config %d",uVar5);
  }
  else {
    local_58._16_4_ = 0xaaaaaaaa;
    local_58[0x14] = 0xaa;
    local_58[0x15] = 0xaa;
    local_58[0x16] = 0xaa;
    local_58[0x17] = 0xaa;
    uStack_40 = (char *)0xaaaaaaaaaaaaaaaa;
    local_58._0_4_ = 0xaaaaaaaa;
    local_58._4_4_ = 0xaaaaaaaa;
    local_58._8_4_ = 0xaaaaaaaa;
    local_58._12_4_ = 0xaaaaaaaa;
    anon_unknown.dwarf_12357::getVisualInfo
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58,screen,
               (optional<unsigned_int>)(uVar10 | 0x100000000),(optional<unsigned_char>)0x0);
    if ((bool)uStack_40._4_1_ != true) {
      lVar4 = QtPrivateLogging::lcQpaGl();
      if ((*(byte *)(lVar4 + 0x10) & 1) != 0) {
        local_78 = *(undefined8 *)(lVar4 + 8);
        local_90[0] = '\x02';
        local_90[1] = '\0';
        local_90[2] = '\0';
        local_90[3] = '\0';
        local_90[4] = '\0';
        local_90[5] = '\0';
        local_90[6] = '\0';
        local_90[7] = '\0';
        local_90[8] = '\0';
        local_90[9] = '\0';
        local_90[10] = '\0';
        local_90[0xb] = '\0';
        local_90[0xc] = '\0';
        local_90[0xd] = '\0';
        local_90[0xe] = '\0';
        local_90[0xf] = '\0';
        local_90[0x10] = '\0';
        local_90[0x11] = '\0';
        local_90[0x12] = '\0';
        local_90[0x13] = '\0';
        local_90[0x14] = '\0';
        local_90[0x15] = '\0';
        local_90[0x16] = '\0';
        local_90[0x17] = '\0';
        QMessageLogger::debug
                  (local_90,
                   "EGL suggested using X Visual ID %d for EGL config %d, but that isn\'t a valid ID"
                   ,uVar10,uVar5);
      }
      goto LAB_001084dd;
    }
    cVar1 = q_hasEglExtension(this->m_egl_display,"EGL_NV_post_convert_rounding");
    if ((cVar1 != '\0') ||
       ((pcVar3 = (char *)eglQueryString(this->m_egl_display,0x3053), pcVar3 != (char *)0x0 &&
        (pcVar3 = strstr(pcVar3,"Vivante"), pcVar3 != (char *)0x0)))) goto LAB_001085a2;
    std::optional<(anonymous_namespace)::VisualInfo>::operator->
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
    uVar2 = local_58._8_4_ - ((uint)local_58._8_4_ >> 1 & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    uVar6 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    std::optional<(anonymous_namespace)::VisualInfo>::operator->
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
    uVar2 = local_58._12_4_ - ((uint)local_58._12_4_ >> 1 & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    uVar8 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    std::optional<(anonymous_namespace)::VisualInfo>::operator->
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
    uVar2 = local_58._16_4_ - ((uint)local_58._16_4_ >> 1 & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    uVar7 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    std::optional<(anonymous_namespace)::VisualInfo>::operator->
              ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
    uVar2 = (uint)(byte)(undefined1)uStack_40 - (uVar8 + uVar6 + uVar7);
    if (((int)uVar6 < configRedSize) ||
       ((((int)uVar8 < configGreenSize || ((int)uVar7 < configBlueSize)) ||
        ((int)uVar2 < configAlphaSize)))) {
      lVar4 = QtPrivateLogging::lcQpaGl();
      if ((*(byte *)(lVar4 + 0x10) & 1) != 0) {
        local_78 = *(undefined8 *)(lVar4 + 8);
        local_90[0] = '\x02';
        local_90[1] = '\0';
        local_90[2] = '\0';
        local_90[3] = '\0';
        local_90[4] = '\0';
        local_90[5] = '\0';
        local_90[6] = '\0';
        local_90[7] = '\0';
        local_90[8] = '\0';
        local_90[9] = '\0';
        local_90[10] = '\0';
        local_90[0xb] = '\0';
        local_90[0xc] = '\0';
        local_90[0xd] = '\0';
        local_90[0xe] = '\0';
        local_90[0xf] = '\0';
        local_90[0x10] = '\0';
        local_90[0x11] = '\0';
        local_90[0x12] = '\0';
        local_90[0x13] = '\0';
        local_90[0x14] = '\0';
        local_90[0x15] = '\0';
        local_90[0x16] = '\0';
        local_90[0x17] = '\0';
        std::optional<(anonymous_namespace)::VisualInfo>::operator->
                  ((optional<(anonymous_namespace)::VisualInfo> *)local_58);
        QMessageLogger::debug
                  (local_90,
                   "EGL suggested using X Visual ID %d (%d %d %d %d depth %d) for EGL config %d(%d %d %d %d), but this is incompatible"
                   ,0,(ulong)uVar6,(ulong)uVar8,(ulong)uVar7,(ulong)uVar2,(ulong)uStack_40 & 0xff,
                   uVar5,(ulong)(uint)configRedSize,(ulong)(uint)configGreenSize,
                   (ulong)(uint)configBlueSize,(ulong)(uint)configAlphaSize);
      }
      goto LAB_001084dd;
    }
    lVar4 = QtPrivateLogging::lcQpaGl();
    if ((*(byte *)(lVar4 + 0x10) & 1) == 0) goto LAB_001085a2;
    uStack_40 = *(char **)(lVar4 + 8);
    pcVar3 = "Using Opaque Visual ID %d provided by EGL for config %d";
    if (0 < configAlphaSize) {
      pcVar3 = "Using ARGB Visual ID %d provided by EGL for config %d";
    }
LAB_00108596:
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58._16_4_ = 0;
    local_58._12_4_ = 0;
    local_58._8_4_ = 0;
    local_58._4_4_ = 0;
    local_58._0_4_ = 2;
    xVar9 = (xcb_visualid_t)uVar10;
    QMessageLogger::debug(local_58,pcVar3,uVar10,uVar5);
  }
LAB_001085a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return xVar9;
}

Assistant:

xcb_visualid_t QXcbEglIntegration::getCompatibleVisualId(xcb_screen_t *screen, EGLConfig config) const
{
    xcb_visualid_t visualId = 0;
    EGLint eglValue = 0;

    EGLint configRedSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_RED_SIZE, &configRedSize);

    EGLint configGreenSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_GREEN_SIZE, &configGreenSize);

    EGLint configBlueSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_BLUE_SIZE, &configBlueSize);

    EGLint configAlphaSize = 0;
    eglGetConfigAttrib(eglDisplay(), config, EGL_ALPHA_SIZE, &configAlphaSize);

    eglGetConfigAttrib(eglDisplay(), config, EGL_CONFIG_ID, &eglValue);
    int configId = eglValue;

    // See if EGL provided a valid VisualID:
    eglGetConfigAttrib(eglDisplay(), config, EGL_NATIVE_VISUAL_ID, &eglValue);
    visualId = eglValue;
    if (visualId) {
        // EGL has suggested a visual id, so get the rest of the visual info for that id:
        std::optional<VisualInfo> chosenVisualInfo = getVisualInfo(screen, visualId);
        if (chosenVisualInfo) {
            // Skip size checks if implementation supports non-matching visual
            // and config (QTBUG-9444).
            if (q_hasEglExtension(eglDisplay(), "EGL_NV_post_convert_rounding"))
                return visualId;
            // Skip also for i.MX6 where 565 visuals are suggested for the default 444 configs and it works just fine.
            const char *vendor = eglQueryString(eglDisplay(), EGL_VENDOR);
            if (vendor && strstr(vendor, "Vivante"))
                return visualId;

            int visualRedSize = qPopulationCount(chosenVisualInfo->visualType.red_mask);
            int visualGreenSize = qPopulationCount(chosenVisualInfo->visualType.green_mask);
            int visualBlueSize = qPopulationCount(chosenVisualInfo->visualType.blue_mask);
            int visualAlphaSize = chosenVisualInfo->depth - visualRedSize - visualBlueSize - visualGreenSize;

            const bool visualMatchesConfig = visualRedSize >= configRedSize
                && visualGreenSize >= configGreenSize
                && visualBlueSize >= configBlueSize
                && visualAlphaSize >= configAlphaSize;

            // In some cases EGL tends to suggest a 24-bit visual for 8888
            // configs. In such a case we have to fall back to getVisualInfo.
            if (!visualMatchesConfig) {
                visualId = 0;
                qCDebug(lcQpaGl,
                        "EGL suggested using X Visual ID %d (%d %d %d %d depth %d) for EGL config %d"
                        "(%d %d %d %d), but this is incompatible",
                        visualId, visualRedSize, visualGreenSize, visualBlueSize, visualAlphaSize, chosenVisualInfo->depth,
                        configId, configRedSize, configGreenSize, configBlueSize, configAlphaSize);
            }
        } else {
            qCDebug(lcQpaGl, "EGL suggested using X Visual ID %d for EGL config %d, but that isn't a valid ID",
                    visualId, configId);
            visualId = 0;
        }
    }
    else
        qCDebug(lcQpaGl, "EGL did not suggest a VisualID (EGL_NATIVE_VISUAL_ID was zero) for EGLConfig %d", configId);

    if (visualId) {
        qCDebug(lcQpaGl, configAlphaSize > 0
                ? "Using ARGB Visual ID %d provided by EGL for config %d"
                : "Using Opaque Visual ID %d provided by EGL for config %d", visualId, configId);
        return visualId;
    }

    // Finally, try to use getVisualInfo and only use the bit depths to match on:
    if (!visualId) {
        uint8_t depth = configRedSize + configGreenSize + configBlueSize + configAlphaSize;
        std::optional<VisualInfo> matchingVisual = getVisualInfo(screen, std::nullopt, depth);
        if (!matchingVisual) {
            // Try again without taking the alpha channel into account:
            depth = configRedSize + configGreenSize + configBlueSize;
            matchingVisual = getVisualInfo(screen, std::nullopt, depth);
        }

        if (matchingVisual)
            visualId = matchingVisual->visualType.visual_id;
    }

    if (visualId) {
        qCDebug(lcQpaGl, "Using Visual ID %d provided by getVisualInfo for EGL config %d", visualId, configId);
        return visualId;
    }

    qWarning("Unable to find an X11 visual which matches EGL config %d", configId);
    return 0;
}